

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::~QWidgetPrivate(QWidgetPrivate *this)

{
  *(undefined ***)this = &PTR__QWidgetPrivate_007c1498;
  if (this->widgetItem != (QWidgetItemV2 *)0x0) {
    (this->widgetItem->super_QWidgetItem).wid = (QWidget *)0x0;
  }
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl != (QWExtra *)0x0) {
    deleteExtra(this);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->gestureContext).d);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&(this->actions).d);
  QLocale::~QLocale(&this->locale);
  QWidgetData::~QWidgetData(&this->data);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->accessibleIdentifier).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->accessibleDescription).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->accessibleName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->whatsThis).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->statusTip).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->toolTip).d);
  QRegion::~QRegion(&this->dirty);
  QRegion::~QRegion(&this->opaqueChildren);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::~unique_ptr(&this->extra);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QWidgetPrivate::~QWidgetPrivate()
{
    if (widgetItem)
        widgetItem->wid = nullptr;

    if (extra)
        deleteExtra();
}